

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O3

void __thiscall
PhyloTreeEdge::PhyloTreeEdge
          (PhyloTreeEdge *this,double attrib,shared_ptr<Bipartition> *originalEdge,int originalID)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  bool bVar3;
  size_t num_bits;
  element_type *this_00;
  allocator<unsigned_long> local_49;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  double local_20;
  
  local_20 = attrib;
  Bipartition::Bipartition(&this->super_Bipartition);
  (this->super_Bipartition)._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__001bbe70;
  this->length = local_20;
  this_00 = (originalEdge->super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->originalEdge).super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  p_Var1 = (originalEdge->super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->originalEdge).super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      this_00 = (originalEdge->super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->originalID = originalID;
  num_bits = Bipartition::size(this_00);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_48,num_bits,0,&local_49);
  if (&local_48 != &(this->super_Bipartition).partition) {
    puVar2 = (this->super_Bipartition).partition.m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->super_Bipartition).partition.m_bits.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->super_Bipartition).partition.m_bits.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->super_Bipartition).partition.m_bits.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 == (pointer)0x0) {
      (this->super_Bipartition).partition.m_num_bits = local_48.m_num_bits;
      local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      operator_delete(puVar2);
      puVar2 = local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this->super_Bipartition).partition.m_num_bits = local_48.m_num_bits;
      local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
        if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("(b.m_bits = buffer_type()).empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                        ,0x2a2,
                        "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator=(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
      }
    }
    local_48.m_num_bits = 0;
  }
  bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_48);
  if (bVar3) {
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("m_check_invariants()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x279,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

PhyloTreeEdge::PhyloTreeEdge(double attrib, const shared_ptr<Bipartition>& originalEdge, int originalID) : originalEdge(originalEdge), originalID(originalID), length(attrib) {
    this->partition = boost::dynamic_bitset<>(originalEdge->size());
}